

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_line_section.cpp
# Opt level: O0

ssize_t __thiscall
pstore::repo::debug_line_section_creation_dispatcher::write
          (debug_line_section_creation_dispatcher *this,int __fd,void *__buf,size_t __n)

{
  debug_line_section *this_00;
  debug_line_section *pdVar1;
  size_t sVar2;
  undefined4 in_register_00000034;
  sources<std::pair<pstore::pointer_based_iterator<const_unsigned_char>,_pstore::pointer_based_iterator<const_unsigned_char>_>,_std::pair<__gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>_>,_std::pair<__gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>_>_>
  local_50;
  debug_line_section *local_20;
  debug_line_section *scn;
  uint8_t *out_local;
  debug_line_section_creation_dispatcher *this_local;
  
  scn = (debug_line_section *)CONCAT44(in_register_00000034,__fd);
  out_local = (uint8_t *)this;
  pdVar1 = (debug_line_section *)
           section_creation_dispatcher::aligned
                     (&this->super_section_creation_dispatcher,(uint8_t *)scn);
  this_00 = scn;
  if (pdVar1 == scn) {
    section_content::make_sources(&local_50,this->section_);
    debug_line_section::
    debug_line_section<std::pair<pstore::pointer_based_iterator<unsigned_char_const>,pstore::pointer_based_iterator<unsigned_char_const>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>>>
              (this_00,&this->header_digest_,&this->header_,&local_50,this->section_->align);
    pdVar1 = scn;
    local_20 = this_00;
    sVar2 = debug_line_section::size_bytes(this_00);
    return (long)&(pdVar1->header_digest_).v_ + sVar2;
  }
  assert_failed("this->aligned (out) == out",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/mcrepo/debug_line_section.cpp"
                ,0x21);
}

Assistant:

std::uint8_t *
        debug_line_section_creation_dispatcher::write (std::uint8_t * const out) const {
            PSTORE_ASSERT (this->aligned (out) == out);
            auto * const scn = new (out) debug_line_section (
                header_digest_, header_, section_->make_sources (), section_->align);
            return out + scn->size_bytes ();
        }